

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.h
# Opt level: O0

void __thiscall
FONQRI::Log::Log(Log *this,string *dateTime,string *line,string *file,string *text,string *type)

{
  string *type_local;
  string *text_local;
  string *file_local;
  string *line_local;
  string *dateTime_local;
  Log *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)dateTime);
  std::__cxx11::string::string((string *)&this->line,(string *)line);
  std::__cxx11::string::string((string *)&this->file,(string *)file);
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  std::__cxx11::string::string((string *)&this->type,(string *)type);
  return;
}

Assistant:

Log(std::string dateTime, std::string line, std::string file,
	std::string text, std::string type)
	: dateTime(dateTime), line(line), file(file), text(text), type(type)
	{
	}